

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O2

void crnlib::console::remove_console_output_func(console_output_func pFunc)

{
  long lVar1;
  uint uVar2;
  scoped_mutex lock;
  scoped_mutex local_20;
  
  init((EVP_PKEY_CTX *)pFunc);
  local_20.m_mutex = m_pMutex;
  mutex::lock(m_pMutex);
  uVar2 = DAT_001bab58;
  while (uVar2 = uVar2 - 1, -1 < (int)uVar2) {
    lVar1 = (ulong)(uVar2 & 0x7fffffff) * 0x10;
    if (*(console_output_func *)(m_output_funcs + lVar1) == pFunc) {
      vector<crnlib::console::console_func>::erase
                ((vector<crnlib::console::console_func> *)&m_output_funcs,
                 (console_func *)(m_output_funcs + lVar1));
    }
  }
  if (DAT_001bab58 == 0) {
    vector<crnlib::console::console_func>::clear
              ((vector<crnlib::console::console_func> *)&m_output_funcs);
  }
  scoped_mutex::~scoped_mutex(&local_20);
  return;
}

Assistant:

void console::remove_console_output_func(console_output_func pFunc)
    {
        init();

        scoped_mutex lock(*m_pMutex);

        for (int i = m_output_funcs.size() - 1; i >= 0; i--)
        {
            if (m_output_funcs[i].m_func == pFunc)
            {
                m_output_funcs.erase(m_output_funcs.begin() + i);
            }
        }

        if (!m_output_funcs.size())
        {
            m_output_funcs.clear();
        }
    }